

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
RunScriptWithParserStateCore
          (DWORD dwBgParseCookie,JsValueRef script,JsSourceContext sourceContext,WCHAR *url,
          JsParseScriptAttributes parseAttributes,JsValueRef parserState,bool parseOnly,
          JsValueRef *result)

{
  anon_class_40_5_5eb8c2e9 fn;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  JsSerializedLoadScriptCallback dummy;
  byte *buffer;
  ArrayBuffer *arrayBuffer;
  uint local_50;
  JsErrorCode errorCode;
  uint sourceIndex;
  bool parseOnly_local;
  JsValueRef parserState_local;
  WCHAR *pWStack_38;
  JsParseScriptAttributes parseAttributes_local;
  WCHAR *url_local;
  JsSourceContext sourceContext_local;
  JsValueRef script_local;
  DWORD dwBgParseCookie_local;
  
  errorCode._3_1_ = parseOnly;
  if (script == (JsValueRef)0x0) {
    script_local._4_4_ = JsErrorNullArgument;
  }
  else if ((dwBgParseCookie == 0) && (parserState == (JsValueRef)0x0)) {
    script_local._4_4_ = JsErrorNullArgument;
  }
  else {
    local_50 = 0;
    fn.parseAttributes._0_4_ = (int)((long)&parserState_local + 4);
    fn.script = (JsValueRef *)&sourceContext_local;
    fn.parseAttributes._4_4_ = (int)((ulong)((long)&parserState_local + 4) >> 0x20);
    fn.sourceContext._0_4_ = (int)&url_local;
    fn.sourceContext._4_4_ = (int)((ulong)&url_local >> 0x20);
    fn.url._0_4_ = (int)&stack0xffffffffffffffc8;
    fn.url._4_4_ = (int)((ulong)&stack0xffffffffffffffc8 >> 0x20);
    fn.sourceIndex = &local_50;
    _sourceIndex = parserState;
    parserState_local._4_4_ = parseAttributes;
    pWStack_38 = url;
    url_local = (WCHAR *)sourceContext;
    sourceContext_local = (JsSourceContext)script;
    script_local._0_4_ = dwBgParseCookie;
    script_local._4_4_ =
         ContextAPINoScriptWrapper_NoRecord<RunScriptWithParserStateCore::__0>(fn,false,false);
    if (script_local._4_4_ == JsNoError) {
      buffer = (byte *)0x0;
      dummy = (JsSerializedLoadScriptCallback)0x0;
      if ((DWORD)script_local == 0) {
        bVar1 = Js::VarIs<Js::ArrayBuffer>(_sourceIndex);
        if (!bVar1) {
          return JsErrorInvalidArgument;
        }
        buffer = (byte *)Js::VarTo<Js::ArrayBuffer>(_sourceIndex);
        iVar2 = (*(((ArrayBuffer *)buffer)->super_ArrayBufferBase).super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x72])();
        dummy = (JsSerializedLoadScriptCallback)CONCAT44(extraout_var,iVar2);
      }
      script_local._4_4_ =
           RunSerializedScriptCore<bool(*)(unsigned_long,void**,_JsParseScriptAttributes*),void(*)(unsigned_long)>
                     (DummyScriptLoadSourceCallbackForRunScriptWithParserState,
                      DummyScriptUnloadCallback,(JsSourceContext)url_local,(uchar *)dummy,
                      (ArrayBuffer *)buffer,(JsSourceContext)url_local,pWStack_38,
                      (DWORD)script_local,(bool)(errorCode._3_1_ & 1),true,result,local_50);
    }
  }
  return script_local._4_4_;
}

Assistant:

CHAKRA_API RunScriptWithParserStateCore(
    _In_ DWORD dwBgParseCookie,
    _In_ JsValueRef script,
    _In_ JsSourceContext sourceContext,
    _In_ WCHAR *url,
    _In_ JsParseScriptAttributes parseAttributes,
    _In_ JsValueRef parserState,
    _In_ bool parseOnly,
    _Out_ JsValueRef *result
)
{
    PARAM_NOT_NULL(script);

    if (dwBgParseCookie == 0)
    {
        PARAM_NOT_NULL(parserState);
    }

    uint sourceIndex = 0;

    JsErrorCode errorCode = ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        const byte* bytes;
        size_t cb;
        LoadScriptFlag loadScriptFlag;

        JsErrorCode errorCode = GetScriptBufferDetails(script, parseAttributes, &loadScriptFlag, &cb, &bytes);
        if (errorCode != JsNoError)
        {
            return errorCode;
        }

        SourceContextInfo* sourceContextInfo = scriptContext->GetSourceContextInfo(sourceContext, nullptr);

        if (sourceContextInfo == nullptr)
        {
            sourceContextInfo = scriptContext->CreateSourceContextInfo(sourceContext, url, wcslen(url), nullptr);
        }

        const int chsize = (loadScriptFlag & LoadScriptFlag_Utf8Source) ?
            sizeof(utf8char_t) : sizeof(WCHAR);

        SRCINFO si = {
            /* sourceContextInfo   */ sourceContextInfo,
            /* dlnHost             */ 0,
            /* ulColumnHost        */ 0,
            /* lnMinHost           */ 0,
            /* ichMinHost          */ 0,
            /* ichLimHost          */ static_cast<ULONG>(cb / chsize), // OK to truncate since this is used to limit sourceText in debugDocument/compilation errors.
            /* ulCharOffset        */ 0,
            /* mod                 */ kmodGlobal,
            /* grfsi               */ 0
        };

        Js::Utf8SourceInfo* utf8SourceInfo = nullptr;
        scriptContext->MakeUtf8SourceInfo(bytes, cb, &si, &utf8SourceInfo, loadScriptFlag, script);

        if (utf8SourceInfo == nullptr)
        {
            return JsErrorInvalidArgument;
        }

        ULONG grfscr = scriptContext->GetParseFlags(loadScriptFlag, utf8SourceInfo, sourceContextInfo);
        utf8SourceInfo->SetParseFlags(grfscr);

        if ((loadScriptFlag & LoadScriptFlag_Utf8Source) != LoadScriptFlag_Utf8Source)
        {
            sourceIndex = scriptContext->SaveSourceNoCopy(utf8SourceInfo, static_cast<charcount_t>(utf8SourceInfo->GetCchLength()), /*isCesu8*/ true);
        }
        else
        {
            // TODO: This length may not be correct because we could have actually parsed a different number of characters
            sourceIndex = scriptContext->SaveSourceNoCopy(utf8SourceInfo, static_cast<charcount_t>(utf8SourceInfo->GetCchLength()), /* isCesu8*/ false);
        }

        return JsNoError;
    });

    if (errorCode != JsNoError)
    {
        return errorCode;
    }

    Js::ArrayBuffer* arrayBuffer = nullptr;
    byte* buffer = nullptr;
    if (dwBgParseCookie == 0)
    {
        if (!Js::VarIs<Js::ArrayBuffer>(parserState))
        {
            return JsErrorInvalidArgument;
        }

        arrayBuffer = Js::VarTo<Js::ArrayBuffer>(parserState);
        buffer = arrayBuffer->GetBuffer();
    }

    JsSerializedLoadScriptCallback dummy = DummyScriptLoadSourceCallbackForRunScriptWithParserState;

    return RunSerializedScriptCore(
        dummy, DummyScriptUnloadCallback,
        sourceContext, // use the same user provided sourceContext as scriptLoadSourceContext
        buffer, arrayBuffer, sourceContext, url, dwBgParseCookie, parseOnly, true, result, sourceIndex);
}